

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O2

int archive_compressor_xz_open(archive_write_filter *f)

{
  int *__s;
  int *piVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  lzma_match_finder lVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined1 *puVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  char *fmt;
  archive *a;
  size_t __size;
  
  piVar1 = (int *)f->data;
  puVar10 = *(undefined1 **)(piVar1 + 0x4a);
  if (puVar10 == (undefined1 *)0x0) {
    __size = 0x10000;
    if (f->archive->magic == 0xb0c5c0de) {
      uVar7 = archive_write_get_bytes_per_block(f->archive);
      __size = (long)(int)uVar7;
      if ((uVar7 < 0x10001) && (__size = 0x10000, uVar7 != 0)) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)(int)uVar7;
        __size = 0x10000 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar2,0);
      }
    }
    *(size_t *)(piVar1 + 0x4c) = __size;
    puVar10 = (undefined1 *)malloc(__size);
    *(undefined1 **)(piVar1 + 0x4a) = puVar10;
    if (puVar10 != (undefined1 *)0x0) goto LAB_0014942e;
    a = f->archive;
    fmt = "Can\'t allocate data for compression buffer";
  }
  else {
LAB_0014942e:
    f->write = archive_compressor_xz_write;
    if (f->code == 9) {
      lVar11 = (long)*piVar1;
      piVar1[0x2c] = option_values[lVar11].dict_size;
      piVar1[0x2e] = 0;
      piVar1[0x2f] = 0;
      piVar1[0x30] = 0;
      piVar1[0x31] = 3;
      piVar1[0x32] = 0;
      piVar1[0x33] = 2;
      piVar1[0x34] = (2 < lVar11) + 1;
      lVar4 = option_values[lVar11].mf;
      piVar1[0x35] = option_values[lVar11].nice_len;
      piVar1[0x36] = lVar4;
      piVar1[0x37] = 0;
      piVar1[0x24] = 1;
      piVar1[0x25] = 0x40000000;
      *(int **)(piVar1 + 0x26) = piVar1 + 0x2c;
      piVar1[0x28] = -1;
      piVar1[0x29] = -1;
    }
    else {
      cVar5 = lzma_lzma_preset(piVar1 + 0x2c);
      if (cVar5 != '\0') {
        archive_set_error(f->archive,-1,"Internal error initializing compression library");
      }
      piVar1[0x24] = 0x21;
      piVar1[0x25] = 0;
      *(int **)(piVar1 + 0x26) = piVar1 + 0x2c;
      piVar1[0x28] = -1;
      piVar1[0x29] = -1;
      puVar10 = *(undefined1 **)(piVar1 + 0x4a);
    }
    __s = piVar1 + 2;
    memset(__s,0,0x88);
    *(undefined1 **)(piVar1 + 8) = puVar10;
    *(undefined8 *)(piVar1 + 10) = *(undefined8 *)(piVar1 + 0x4c);
    if (f->code == 5) {
      iVar8 = lzma_alone_encoder(__s,piVar1 + 0x2c);
    }
    else if (f->code == 6) {
      if (piVar1[1] == 1) {
        iVar8 = lzma_stream_encoder(__s,piVar1 + 0x24,4);
      }
      else {
        iVar8 = lzma_stream_encoder_mt(__s);
      }
    }
    else {
      uVar7 = piVar1[0x2c];
      if (0x1ffff000 < uVar7 - 0x1000) {
        archive_set_error(f->archive,-1,"Unacceptable dictionary size for lzip: %d",(ulong)uVar7);
        return -0x1e;
      }
      for (uVar9 = 0x1d;
          (uVar13 = 0xb, 0xb < uVar9 && (uVar13 = uVar9, (uVar7 >> (uVar9 & 0x1f) & 1) == 0));
          uVar9 = uVar9 - 1) {
      }
      bVar3 = (byte)uVar13;
      bVar6 = 0;
      bVar12 = bVar3;
      if (1 << (bVar3 & 0x1f) < (int)uVar7) {
        bVar12 = bVar3 + 1;
        bVar6 = (byte)(((int)((1 << (bVar12 & 0x1f)) - uVar7) / (1 << (bVar3 - 3 & 0x1f)) & 7U) << 5
                      );
      }
      piVar1[0x50] = 0;
      *puVar10 = 0x4c;
      *(undefined1 *)(*(long *)(piVar1 + 0x4a) + 1) = 0x5a;
      *(undefined1 *)(*(long *)(piVar1 + 0x4a) + 2) = 0x49;
      *(undefined1 *)(*(long *)(piVar1 + 0x4a) + 3) = 0x50;
      *(undefined1 *)(*(long *)(piVar1 + 0x4a) + 4) = 1;
      *(byte *)(*(long *)(piVar1 + 0x4a) + 5) = bVar12 & 0x1f | bVar6;
      *(long *)(piVar1 + 8) = *(long *)(piVar1 + 8) + 6;
      *(long *)(piVar1 + 10) = *(long *)(piVar1 + 10) + -6;
      iVar8 = lzma_raw_encoder(__s,piVar1 + 0x24);
    }
    if (iVar8 == 0) {
      f->data = piVar1;
      return 0;
    }
    if (iVar8 != 5) {
      a = f->archive;
      fmt = "Internal error initializing compression library: It\'s a bug in liblzma";
      iVar8 = -1;
      goto LAB_001496fd;
    }
    a = f->archive;
    fmt = "Internal error initializing compression library: Cannot allocate memory";
  }
  iVar8 = 0xc;
LAB_001496fd:
  archive_set_error(a,iVar8,fmt);
  return -0x1e;
}

Assistant:

static int
archive_compressor_xz_open(struct archive_write_filter *f)
{
	struct private_data *data = f->data;
	int ret;

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed = malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_xz_write;

	/* Initialize compression library. */
	if (f->code == ARCHIVE_FILTER_LZIP) {
		const struct option_value *val =
		    &option_values[data->compression_level];

		data->lzma_opt.dict_size = val->dict_size;
		data->lzma_opt.preset_dict = NULL;
		data->lzma_opt.preset_dict_size = 0;
		data->lzma_opt.lc = LZMA_LC_DEFAULT;
		data->lzma_opt.lp = LZMA_LP_DEFAULT;
		data->lzma_opt.pb = LZMA_PB_DEFAULT;
		data->lzma_opt.mode =
		    data->compression_level<= 2? LZMA_MODE_FAST:LZMA_MODE_NORMAL;
		data->lzma_opt.nice_len = val->nice_len;
		data->lzma_opt.mf = val->mf;
		data->lzma_opt.depth = 0;
		data->lzmafilters[0].id = LZMA_FILTER_LZMA1;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	} else {
		if (lzma_lzma_preset(&data->lzma_opt, data->compression_level)) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "Internal error initializing compression library");
		}
		data->lzmafilters[0].id = LZMA_FILTER_LZMA2;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	}
	ret = archive_compressor_xz_init_stream(f, data);
	if (ret == LZMA_OK) {
		f->data = data;
		return (0);
	}
	return (ARCHIVE_FATAL);
}